

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFireFightingFactored.cpp
# Opt level: O0

void __thiscall
ProblemFireFightingFactored::ConstructObservations(ProblemFireFightingFactored *this)

{
  ostream *poVar1;
  MultiAgentDecisionProcessDiscreteFactoredStates *this_00;
  string *name_00;
  char *in_RDI;
  string descr;
  string name;
  stringstream ss;
  string whatObs;
  Index obsI;
  size_t nrObservationsThisAgent;
  Index agentIndex;
  string *in_stack_fffffffffffffd78;
  Index AI;
  undefined4 in_stack_fffffffffffffdb0;
  uint uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  allocator<char> local_219;
  string local_218 [32];
  string local_1f8 [32];
  stringstream local_1d8 [16];
  ostream local_1c8 [392];
  string local_40 [36];
  uint local_1c;
  ulong local_18;
  uint local_c;
  
  for (local_c = 0; (ulong)local_c < *(ulong *)(in_RDI + 0x708); local_c = local_c + 1) {
    local_18 = 2;
    for (local_1c = 0; local_1c < local_18; local_1c = local_1c + 1) {
      std::__cxx11::string::string(local_40);
      uVar2 = local_1c;
      if (local_1c == 0) {
        std::__cxx11::string::operator=(local_40,"Flames__");
      }
      else if (local_1c == 1) {
        std::__cxx11::string::operator=(local_40,"NoFlames");
      }
      std::__cxx11::stringstream::stringstream(local_1d8);
      std::operator<<(local_1c8,local_40);
      std::__cxx11::stringstream::str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffdc0,in_RDI,
                 (allocator<char> *)CONCAT44(uVar2,in_stack_fffffffffffffdb0));
      std::__cxx11::stringstream::str((string *)local_1d8);
      std::__cxx11::string::~string(local_218);
      std::allocator<char>::~allocator(&local_219);
      poVar1 = std::operator<<(local_1c8,"Observation ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1c);
      this_00 = (MultiAgentDecisionProcessDiscreteFactoredStates *)
                std::operator<<(poVar1," of agent ");
      poVar1 = (ostream *)std::ostream::operator<<(this_00,local_c);
      name_00 = (string *)std::operator<<(poVar1,": ");
      AI = (Index)((ulong)poVar1 >> 0x20);
      std::operator<<((ostream *)name_00,local_40);
      std::__cxx11::stringstream::str();
      MultiAgentDecisionProcessDiscreteFactoredStates::AddObservation
                (this_00,AI,name_00,in_stack_fffffffffffffd78);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc0);
      std::__cxx11::string::~string(local_1f8);
      std::__cxx11::stringstream::~stringstream(local_1d8);
      std::__cxx11::string::~string(local_40);
    }
  }
  return;
}

Assistant:

void ProblemFireFightingFactored::ConstructObservations()
{
    /// add observations:
    for(Index agentIndex=0; agentIndex < _m_nrAgents; agentIndex++)
    {
        size_t nrObservationsThisAgent = 2; //flames or no flames
//         _m_nrObservations.push_back(nrObservationsThisAgent);
//         _m_observationVecs.push_back( vector<ObservationDiscrete>() );
        for(Index obsI=0; obsI < nrObservationsThisAgent; obsI++)
        {

            string whatObs;
            switch(obsI){
            case(FLAMES):    whatObs = "Flames__";
                break;
            case(NOFLAMES):    whatObs = "NoFlames";
                break;
            }
            stringstream ss;
            //ss << "Ag" <<agentIndex << ":" << whatObs;
            ss << whatObs;
            string name = ss.str();
            ss.str("");
            ss << "Observation " << obsI << " of agent " << agentIndex << ": " << whatObs;
            string descr = ss.str();
//             ObservationDiscrete od_temp = ObservationDiscrete(obsI,name,descr);
//             _m_observationVecs[agentIndex].push_back( od_temp );
            AddObservation(agentIndex,name,descr);
        }
    }
}